

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O1

Try<void> __thiscall
async_simple::coro::detail::LazyAwaiterBase<async_simple::Try<void>_>::awaitResume
          (LazyAwaiterBase<async_simple::Try<void>_> *this)

{
  void *pvVar1;
  Try<void> *pTVar2;
  long *in_RSI;
  Try<void> r;
  
  pTVar2 = LazyPromise<async_simple::Try<void>_>::result
                     ((LazyPromise<async_simple::Try<void>_> *)(*in_RSI + 0x10));
  pvVar1 = (pTVar2->_error)._M_exception_object;
  (pTVar2->_error)._M_exception_object = (void *)0x0;
  (**(code **)(*in_RSI + 8))();
  *in_RSI = 0;
  (this->_handle).__handle_ = pvVar1;
  return (Try<void>)(exception_ptr)this;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }